

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTransform.cpp
# Opt level: O3

void __thiscall
xmrig::ConfigTransform::transform(ConfigTransform *this,Document *doc,int key,char *arg)

{
  size_t sVar1;
  unsigned_long value;
  uint64_t arg_00;
  long value_00;
  ulong value_01;
  Type pGVar2;
  Value *obj;
  ulonglong uVar3;
  char *pcVar4;
  int __base;
  char *pcVar5;
  Ch *pCVar6;
  bool value_02;
  char *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Data local_38;
  
  BaseTransform::transform(&this->super_BaseTransform,doc,key,arg);
  if (key < 0x3fc) {
    if ((key == 0x74) || (key == 0x76)) goto switchD_0016e6cf_caseD_3fd;
    if (key != 0x3f1) {
      return;
    }
    pcVar4 = "huge-pages";
LAB_0016e80a:
    pcVar5 = "cpu";
LAB_0016e811:
    value_02 = false;
LAB_0016e81a:
    BaseTransform::set<bool>(&this->super_BaseTransform,doc,pcVar5,pcVar4,value_02);
    return;
  }
  switch(key) {
  case 0x3fc:
    pcVar4 = strstr(arg,"0x");
    if (pcVar4 == (char *)0x0) {
      __base = 10;
    }
    else {
      __base = 0x10;
      arg = pcVar4;
    }
    uVar3 = strtoull(arg,(char **)0x0,__base);
    this->m_affinity = uVar3;
    return;
  case 0x3fd:
switchD_0016e6cf_caseD_3fd:
    arg_00 = strtol(arg,(char **)0x0,10);
    transformUint64(this,doc,key,arg_00);
    return;
  case 0x3fe:
  case 0x3ff:
  case 0x401:
    goto switchD_0016e666_caseD_579;
  case 0x400:
    pcVar4 = "enabled";
    goto LAB_0016e80a;
  case 0x402:
    value = strtol(arg,(char **)0x0,10);
    pcVar5 = "cpu";
    pcVar4 = "max-threads-hint";
LAB_0016e849:
    BaseTransform::set<unsigned_long>(&this->super_BaseTransform,doc,pcVar5,pcVar4,value);
    return;
  case 0x403:
    value_00 = strtol(arg,(char **)0x0,10);
    BaseTransform::set<long>(&this->super_BaseTransform,doc,"cpu","memory-pool",value_00);
    return;
  }
  switch(key) {
  case 0x4b3:
    BaseTransform::set<bool>(&this->super_BaseTransform,doc,"cuda","enabled",true);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_48,(Ch *)doc);
    if (local_48 ==
        (char *)((ulong)(doc->
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ).data_.s.length * 0x20 +
                ((ulong)(doc->
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ).data_.s.str & 0xffffffffffff))) {
      local_38.s.str = (Ch *)0x40500000018832b;
      local_38.n.i64 = (Number)0x4;
      local_48 = (char *)0x0;
      _uStack_40 = (Ch *)0x3000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&doc->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_38.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_48,doc->allocator_);
    }
    pcVar4 = "cuda";
LAB_0016ea4c:
    obj = rapidjson::
          GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          ::operator[]<char_const>
                    ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      *)doc,pcVar4);
    pcVar4 = "devices-hint";
    goto LAB_0016eaf8;
  case 0x4b4:
  case 0x4b5:
  case 0x4b6:
    break;
  case 0x4b7:
    pcVar5 = "cuda";
    pcVar4 = "enabled";
    value_02 = true;
    goto LAB_0016e81a;
  case 0x4b8:
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_48,(Ch *)doc);
    if (local_48 ==
        (char *)((ulong)(doc->
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ).data_.s.length * 0x20 +
                ((ulong)(doc->
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ).data_.s.str & 0xffffffffffff))) {
      local_38.s.str = (Ch *)0x40500000018832b;
      local_38.n.i64 = (Number)0x4;
      local_48 = (char *)0x0;
      _uStack_40 = (Ch *)0x3000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&doc->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_38.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_48,doc->allocator_);
    }
    pcVar4 = "cuda";
LAB_0016eae9:
    obj = rapidjson::
          GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          ::operator[]<char_const>
                    ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      *)doc,pcVar4);
    pcVar4 = "loader";
LAB_0016eaf8:
    BaseTransform::set<char_const*>(&this->super_BaseTransform,doc,obj,pcVar4,arg);
    break;
  case 0x4b9:
    pcVar5 = "cuda";
    pcVar4 = "nvml";
    goto LAB_0016e811;
  case 0x4ba:
    value_01 = strtol(arg,(char **)0x0,10);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_48,(Ch *)doc);
    if (local_48 ==
        (char *)((ulong)(doc->
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ).data_.s.length * 0x20 +
                ((ulong)(doc->
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ).data_.s.str & 0xffffffffffff))) {
      local_48 = "health-print-time";
      uStack_40 = 0x11;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_long>
                (&doc->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ,(StringRefType *)&local_48,value_01,doc->allocator_);
    }
    else {
      pGVar2 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)doc,"health-print-time");
      pCVar6 = (Ch *)((ulong)((value_01 & 0xffffffff80000000) == 0) << 0x35 | 0x1d6000000000000);
      if (value_01 >> 0x20 != 0) {
        pCVar6 = (Ch *)(~value_01 >> 8 & 0x80000000000000 | 0x116000000000000);
      }
      *(ulong *)&pGVar2->data_ = value_01;
      (pGVar2->data_).s.str = pCVar6;
    }
    break;
  default:
    switch(key) {
    case 0x578:
      sVar1 = strlen(arg);
      if (sVar1 < 3) {
        value = strtol(arg,(char **)0x0,10);
        pcVar5 = "opencl";
        pcVar4 = "platform";
        goto LAB_0016e849;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_48,(Ch *)doc);
      if (local_48 ==
          (char *)((ulong)(doc->
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ).data_.s.length * 0x20 +
                  ((ulong)(doc->
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ).data_.s.str & 0xffffffffffff))) {
        local_38.s.str = (Ch *)0x4050000001882e7;
        local_38.n.i64 = (Number)0x6;
        local_48 = (char *)0x0;
        _uStack_40 = (Ch *)0x3000000000000;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&doc->
                     super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_38.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_48,doc->allocator_);
      }
      obj = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)doc,"opencl");
      pcVar4 = "platform";
      goto LAB_0016eaf8;
    case 0x57a:
      (this->super_BaseTransform).field_0xd = 1;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_48,(Ch *)doc);
      if (local_48 ==
          (char *)((ulong)(doc->
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ).data_.s.length * 0x20 +
                  ((ulong)(doc->
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ).data_.s.str & 0xffffffffffff))) {
        local_38.s.str = (Ch *)0x4050000001882e7;
        local_38.n.i64 = (Number)0x6;
        local_48 = (char *)0x0;
        _uStack_40 = (Ch *)0x3000000000000;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&doc->
                     super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_38.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_48,doc->allocator_);
      }
      pcVar4 = "opencl";
      goto LAB_0016ea4c;
    case 0x57c:
      pcVar5 = "opencl";
      pcVar4 = "cache";
      goto LAB_0016e811;
    case 0x57e:
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_48,(Ch *)doc);
      if (local_48 ==
          (char *)((ulong)(doc->
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ).data_.s.length * 0x20 +
                  ((ulong)(doc->
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ).data_.s.str & 0xffffffffffff))) {
        local_38.s.str = (Ch *)0x4050000001882e7;
        local_38.n.i64 = (Number)0x6;
        local_48 = (char *)0x0;
        _uStack_40 = (Ch *)0x3000000000000;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&doc->
                     super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_38.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_48,doc->allocator_);
      }
      pcVar4 = "opencl";
      goto LAB_0016eae9;
    case 0x583:
      (this->super_BaseTransform).field_0xd = 1;
    }
  }
switchD_0016e666_caseD_579:
  return;
}

Assistant:

void xmrig::ConfigTransform::transform(rapidjson::Document &doc, int key, const char *arg)
{
    BaseTransform::transform(doc, key, arg);

    switch (key) {
    case IConfig::AVKey:          /* --av */
    case IConfig::CPUPriorityKey: /* --cpu-priority */
    case IConfig::ThreadsKey:     /* --threads */
        return transformUint64(doc, key, static_cast<uint64_t>(strtol(arg, nullptr, 10)));

    case IConfig::HugePagesKey: /* --no-huge-pages */
    case IConfig::CPUKey:       /* --no-cpu */
        return transformBoolean(doc, key, false);

    case IConfig::CPUAffinityKey: /* --cpu-affinity */
        {
            const char *p  = strstr(arg, "0x");
            return transformUint64(doc, key, p ? strtoull(p, nullptr, 16) : strtoull(arg, nullptr, 10));
        }

    case IConfig::CPUMaxThreadsKey: /* --cpu-max-threads-hint */
        return set(doc, kCpu, "max-threads-hint", static_cast<uint64_t>(strtol(arg, nullptr, 10)));

    case IConfig::MemoryPoolKey: /* --cpu-memory-pool */
        return set(doc, kCpu, "memory-pool", static_cast<int64_t>(strtol(arg, nullptr, 10)));
        break;

#   ifdef XMRIG_FEATURE_OPENCL
    case IConfig::OclKey: /* --opencl */
        m_opencl = true;
        break;

    case IConfig::OclCacheKey: /* --opencl-no-cache */
        return set(doc, kOcl, "cache", false);

    case IConfig::OclLoaderKey: /* --opencl-loader */
        return set(doc, kOcl, "loader", arg);

    case IConfig::OclDevicesKey: /* --opencl-devices */
        m_opencl = true;
        return set(doc, kOcl, "devices-hint", arg);

    case IConfig::OclPlatformKey: /* --opencl-platform */
        if (strlen(arg) < 3) {
            return set(doc, kOcl, "platform", static_cast<uint64_t>(strtol(arg, nullptr, 10)));
        }

        return set(doc, kOcl, "platform", arg);
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    case IConfig::CudaKey: /* --cuda */
        return set(doc, kCuda, kEnabled, true);

    case IConfig::CudaLoaderKey: /* --cuda-loader */
        return set(doc, kCuda, "loader", arg);

    case IConfig::CudaDevicesKey: /* --cuda-devices */
        set(doc, kCuda, kEnabled, true);
        return set(doc, kCuda, "devices-hint", arg);
#   endif

#   ifdef XMRIG_FEATURE_NVML
    case IConfig::NvmlKey: /* --no-nvml */
        return set(doc, kCuda, "nvml", false);

    case IConfig::HealthPrintTimeKey: /* --health-print-time */
        return set(doc, "health-print-time", static_cast<uint64_t>(strtol(arg, nullptr, 10)));
#   endif

    default:
        break;
    }
}